

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

string * __thiscall
t_js_generator::ts_indent_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  char cVar1;
  char *__rhs;
  string local_38;
  t_js_generator *local_18;
  t_js_generator *this_local;
  
  local_18 = this;
  this_local = (t_js_generator *)__return_storage_ptr__;
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  cVar1 = std::__cxx11::string::empty();
  __rhs = "  ";
  if (cVar1 != '\0') {
    __rhs = "";
  }
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ts_indent() { return indent() + (!ts_module_.empty() ? "  " : ""); }